

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr_str,SPIRType *type,
          uint32_t physical_type_id,bool packed,bool row_major)

{
  uint uVar1;
  bool bVar2;
  uint __tmp;
  int iVar3;
  SPIRType *type_00;
  undefined7 in_register_00000089;
  char (*ts_3) [2];
  long lVar4;
  char **ts_5;
  undefined4 uStack_88;
  uint32_t columns;
  string *local_80;
  uint local_78;
  uint32_t vecsize;
  string local_70;
  undefined4 local_50;
  uint32_t physical_vecsize;
  char *load_swiz;
  char *base_type;
  char *data_swiz;
  
  ts_3 = (char (*) [2])CONCAT71(in_register_00000089,packed);
  local_50 = SUB84(ts_3,0);
  if (physical_type_id == 0 && !packed) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr_str);
    return __return_storage_ptr__;
  }
  type_00 = type;
  local_80 = expr_str;
  if (physical_type_id != 0) {
    type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,physical_type_id);
    uVar1 = type_00->vecsize;
    bVar2 = Compiler::is_vector((Compiler *)this,type_00);
    if (((bVar2) && (bVar2 = Compiler::is_array((Compiler *)this,type_00), bVar2 && uVar1 < 5)) &&
       (type->vecsize < type_00->vecsize)) {
      ::std::__cxx11::string::string
                ((string *)&local_70,unpack_expression_type::swizzle_lut[type->vecsize - 1],
                 (allocator *)&base_type);
      if ((string *)local_80->_M_string_length < local_70._M_string_length) {
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        iVar3 = ::std::__cxx11::string::compare
                          ((ulong)local_80,
                           (long)local_80->_M_string_length - local_70._M_string_length,
                           (string *)local_70._M_string_length);
        ::std::__cxx11::string::~string((string *)&local_70);
        if (iVar3 == 0) goto LAB_001dda1d;
      }
      if (2 < type->vecsize - 1) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x15ce,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression(&local_70,&this->super_CompilerGLSL,local_80);
      ::std::operator+(__return_storage_ptr__,&local_70,
                       unpack_expression_type::swizzle_lut[type->vecsize - 1]);
      goto LAB_001ddafb;
    }
LAB_001dda1d:
    bVar2 = Compiler::is_matrix((Compiler *)this,type_00);
    if (((bVar2) && (bVar2 = Compiler::is_vector((Compiler *)this,type), bVar2 && uVar1 < 5)) &&
       (type->vecsize < type_00->vecsize)) {
      if (3 < type->vecsize - 1) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x15d6,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression(&local_70,&this->super_CompilerGLSL,local_80);
      ::std::operator+(__return_storage_ptr__,&local_70,
                       unpack_expression_type::swizzle_lut[type->vecsize - 1]);
      goto LAB_001ddafb;
    }
  }
  bVar2 = Compiler::is_matrix((Compiler *)this,type);
  if (bVar2) {
    vecsize = type->vecsize;
    if (row_major) {
      lVar4 = 0x1c;
      columns = vecsize;
      vecsize = type->columns;
    }
    else {
      lVar4 = 0x18;
      columns = type->columns;
    }
    uVar1 = *(uint *)((type_00->array).stack_storage.aligned_char + lVar4 + -0x38);
    base_type = "float";
    if (type->width == 0x10) {
      base_type = "half";
    }
    ts_5 = (char **)0x1ddb58;
    physical_vecsize = uVar1;
    join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&base_type,(char **)&columns,(uint *)0x292da9,
               (char (*) [2])&vecsize,(uint *)0x29618e,(char (*) [2])CONCAT44(columns,uStack_88));
    data_swiz = ".data";
    if (uVar1 < 5) {
      data_swiz = "";
    }
    load_swiz = "";
    if (uVar1 != vecsize) {
      load_swiz = unpack_expression_type::swizzle_lut[vecsize - 1];
    }
    for (local_78 = 0; local_78 < columns; local_78 = local_78 + 1) {
      if (local_78 != 0) {
        ts_5 = (char **)0x1ddbd0;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((char)local_50 == '\0') {
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&,char_const*&>
                  (&local_70,(spirv_cross *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2828da,
                   (char (*) [2])&local_78,(uint *)0x2827df,(char (*) [2])&data_swiz,&load_swiz,ts_5
                  );
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                  (&local_70,(spirv_cross *)&base_type,(char **)&physical_vecsize,(uint *)0x29618e,
                   (char (*) [2])local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2828da,
                   (char (*) [2])&local_78,(uint *)0x2827df,(char (*) [2])0x27e75d,
                   (char (*) [2])&load_swiz,(char **)CONCAT44(columns,uStack_88));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ts_5 = (char **)0x1ddc4b;
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_70,this,type,0);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
             (char (*) [2])local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,ts_3);
LAB_001ddafb:
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
		"",
	};

	// TODO: Move everything to the template wrapper?
	bool uses_std140_wrapper = physical_type && physical_type->vecsize > 4;

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    !uses_std140_wrapper &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) &&
	         !uses_std140_wrapper &&
	         physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 4);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";
		const char *data_swiz = physical_vecsize > 4 ? ".data" : "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", data_swiz, load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}